

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_check_chunk_name(png_const_structrp png_ptr,png_uint_32 chunk_name)

{
  uint uVar1;
  uint local_1c;
  int c;
  png_uint_32 cn;
  int i;
  png_uint_32 chunk_name_local;
  png_const_structrp png_ptr_local;
  
  c = 1;
  local_1c = chunk_name;
  while( true ) {
    if (4 < c) {
      return;
    }
    uVar1 = local_1c & 0xff;
    if (((uVar1 < 0x41) || (0x7a < uVar1)) || ((0x5a < uVar1 && (uVar1 < 0x61)))) break;
    local_1c = local_1c >> 8;
    c = c + 1;
  }
  png_chunk_error(png_ptr,"invalid chunk type");
}

Assistant:

void /* PRIVATE */
png_check_chunk_name(png_const_structrp png_ptr, png_uint_32 chunk_name)
{
   int i;
   png_uint_32 cn=chunk_name;

   png_debug(1, "in png_check_chunk_name");

   for (i=1; i<=4; ++i)
   {
      int c = cn & 0xff;

      if (c < 65 || c > 122 || (c > 90 && c < 97))
         png_chunk_error(png_ptr, "invalid chunk type");

      cn >>= 8;
   }
}